

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp:214:57)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_function_object_cpp:214:57)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  uint32_t uVar1;
  void *pvVar2;
  long *plVar3;
  void *pvVar4;
  undefined8 *puVar5;
  function_object *this_00;
  native_error_exception *this_01;
  global_object *pgVar6;
  uint32_t index;
  pointer pvVar7;
  anon_class_16_1_570cf4e1_for_f *this_02;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  object_ptr a;
  object_ptr p;
  vector<mjs::value,_std::allocator<mjs::value>_> new_args;
  gc_heap_ptr<mjs::function_object> f;
  wostringstream woss;
  bool local_279;
  wstring_view local_278;
  gc_heap_ptr_untyped *local_268;
  undefined1 local_260 [16];
  wstring local_250;
  vector<mjs::value,_std::allocator<mjs::value>_> *local_230;
  value *local_228;
  value local_220;
  vector<mjs::value,_std::allocator<mjs::value>_> local_1f8;
  gc_heap_ptr_untyped local_1d8;
  gc_heap_ptr_untyped local_1c8;
  gc_heap *local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_1b0;
  wostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_228 = __return_storage_ptr__;
  anon_unknown_65::get_function_object_ptr((anon_unknown_65 *)&local_1c8,this_);
  local_1f8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar7 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_230 = args;
  if (((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) * -0x3333333333333333)
       < 2) || (pvVar7[1].type_ < boolean)) goto LAB_00149c66;
  std::__cxx11::wostringstream::wostringstream(local_1a8);
  this_02 = &this->f;
  pvVar7 = (local_230->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_268 = (gc_heap_ptr_untyped *)this_02;
  if (pvVar7[1].type_ != object) {
    debug_print((wostream *)local_1a8,pvVar7 + 1,4,0x7fffffff,0);
    goto LAB_00149cec;
  }
  local_278._M_len =
       (size_t)pvVar7[1].field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
               heap_;
  local_278._M_str =
       (wchar_t *)CONCAT44(local_278._M_str._4_4_,*(undefined4 *)((long)&pvVar7[1].field_1 + 8));
  if ((gc_heap *)local_278._M_len != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_278._M_len,(gc_heap_ptr_untyped *)&local_278);
  }
  pvVar2 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_278);
  if (*(int *)((long)pvVar2 + 0x14) == 0) {
    local_260._0_8_ = (gc_heap *)0x0;
    local_260._8_8_ = local_260._8_8_ & 0xffffffff00000000;
  }
  else {
    gc_heap::unsafe_create_from_position<mjs::object>
              ((gc_heap *)local_260,(uint32_t)*(undefined8 *)((long)pvVar2 + 8));
  }
  pvVar2 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_02);
  if (*(int *)((long)pvVar2 + 0x20) < 2) {
    bVar10 = (gc_heap *)local_260._0_8_ != (gc_heap *)0x0;
    if (bVar10) {
      pvVar2 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_260);
      plVar3 = (long *)gc_heap_ptr_untyped::get(local_268);
      (**(code **)(*plVar3 + 0x70))(&local_1d8,plVar3);
      pvVar4 = gc_heap_ptr_untyped::get(&local_1d8);
      if (pvVar2 == pvVar4) {
        bVar10 = true;
        local_279 = true;
        goto LAB_00149ad4;
      }
    }
    pgVar6 = (global_object *)gc_heap_ptr_untyped::get(local_268);
    local_279 = global_object::is_arguments_array(pgVar6,(object_ptr *)&local_278);
  }
  else {
    local_279 = true;
    bVar10 = false;
  }
LAB_00149ad4:
  if (bVar10) {
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1d8);
  }
  if (local_279 == false) {
    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_278);
    object::class_name((object *)&local_220);
    mjs::operator<<((wostream *)local_1a8,(string *)&local_220);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_220);
  }
  else {
    puVar5 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_278);
    local_250._M_dataplus._M_p = (pointer)0x6;
    local_250._M_string_length = 0x1b0564;
    (**(code **)*puVar5)(&local_220,puVar5);
    uVar1 = to_uint32(&local_220);
    value::destroy(&local_220);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::resize(&local_1f8,(ulong)uVar1);
    if (uVar1 != 0) {
      lVar8 = 0;
      uVar9 = 0;
      do {
        puVar5 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_278);
        index_string_abi_cxx11_(&local_250,(mjs *)(uVar9 & 0xffffffff),index);
        local_1b8 = (gc_heap *)local_250._M_string_length;
        local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                     *)local_250._M_dataplus._M_p;
        (**(code **)*puVar5)(&local_220,puVar5,&local_1b8);
        value::operator=((value *)((long)&(local_1f8.
                                           super__Vector_base<mjs::value,_std::allocator<mjs::value>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->type_ + lVar8
                                  ),&local_220);
        value::destroy(&local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x28;
      } while (uVar1 != uVar9);
    }
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_260);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_278);
  if (local_279 == false) {
LAB_00149cec:
    std::operator<<((wostream *)local_1a8," is not an (arguments) array");
    this_01 = (native_error_exception *)__cxa_allocate_exception(0x58);
    pgVar6 = (global_object *)gc_heap_ptr_untyped::get(local_268);
    global_object::stack_trace_abi_cxx11_((wstring *)&local_220,pgVar6);
    local_278._M_len = (size_t)local_220.field_1.n_;
    local_278._M_str = (wchar_t *)local_220._0_8_;
    std::__cxx11::wstringbuf::str();
    local_260._0_8_ = local_250._M_string_length;
    local_260._8_8_ = local_250._M_dataplus._M_p;
    native_error_exception::native_error_exception
              (this_01,type,&local_278,(wstring_view *)local_260);
    __cxa_throw(this_01,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  }
  std::__cxx11::wostringstream::~wostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_00149c66:
  this_00 = (function_object *)gc_heap_ptr_untyped::get(&local_1c8);
  pvVar7 = (local_230->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar7 == (local_230->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    pvVar7 = (pointer)&value::undefined;
  }
  function_object::call(local_228,this_00,pvVar7,&local_1f8);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_1f8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1c8);
  return local_228;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }